

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Shrink(sqlite3_pcache *p)

{
  uint uVar1;
  PGroup *pPVar2;
  PCache1 *in_RDI;
  uint savedMaxPage;
  PGroup *pGroup;
  PCache1 *pCache;
  
  if (in_RDI->bPurgeable != 0) {
    pPVar2 = in_RDI->pGroup;
    uVar1 = pPVar2->nMaxPage;
    pPVar2->nMaxPage = 0;
    pcache1EnforceMaxPage(in_RDI);
    pPVar2->nMaxPage = uVar1;
  }
  return;
}

Assistant:

static void pcache1Shrink(sqlite3_pcache *p){
  PCache1 *pCache = (PCache1*)p;
  if( pCache->bPurgeable ){
    PGroup *pGroup = pCache->pGroup;
    unsigned int savedMaxPage;
    pcache1EnterMutex(pGroup);
    savedMaxPage = pGroup->nMaxPage;
    pGroup->nMaxPage = 0;
    pcache1EnforceMaxPage(pCache);
    pGroup->nMaxPage = savedMaxPage;
    pcache1LeaveMutex(pGroup);
  }
}